

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void session(socket *socket,shared_ptr<KeyValueStore> *k)

{
  ulong_long_type uVar1;
  bool bVar2;
  system_error *this;
  error_code eVar3;
  error_code ec;
  mutable_buffers_1 local_a8;
  char data [24];
  
  ec.val_ = 0;
  ec._4_4_ = ec._4_4_ & 0xffffff00;
  ec.cat_ = boost::system::system_category();
  local_a8.super_mutable_buffer.data_ = data;
  data[0x10] = '\0';
  data[0x11] = '\0';
  data[0x12] = '\0';
  data[0x13] = '\0';
  data[0x14] = '\0';
  data[0x15] = '\0';
  data[0x16] = '\0';
  data[0x17] = '\0';
  data[0] = '\0';
  data[1] = '\0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\0';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\0';
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  local_a8.super_mutable_buffer.size_ = 0x18;
  boost::asio::
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::read_some<boost::asio::mutable_buffers_1>(socket,&local_a8,&ec);
  eVar3 = boost::asio::error::make_error_code(eof);
  if (ec.val_ == eVar3.val_) {
    uVar1 = (eVar3.cat_)->id_;
    bVar2 = (ec.cat_)->id_ == uVar1;
    if (uVar1 == 0) {
      bVar2 = ec.cat_ == eVar3.cat_;
    }
    if (bVar2) {
      return;
    }
  }
  if (ec.failed_ != true) {
    return;
  }
  this = (system_error *)__cxa_allocate_exception(0x40);
  eVar3.failed_ = ec.failed_;
  eVar3._5_3_ = ec._5_3_;
  eVar3.val_ = ec.val_;
  eVar3.cat_ = ec.cat_;
  boost::system::system_error::system_error(this,eVar3);
  __cxa_throw(this,&boost::system::system_error::typeinfo,boost::system::system_error::~system_error
             );
}

Assistant:

void session(tcp::socket socket, const std::shared_ptr<KeyValueStore>& k) {
  boost::system::error_code ec;
  try {
    for (;;) {
      char data[Packet::HEADER_LENGTH] = { 0 };
      size_t bytes_read = socket.read_some(boost::asio::buffer(data), ec);
      if (ec == boost::asio::error::eof) {
        return;
      } else if (ec) {
        throw boost::system::system_error(ec);
      } else if (data[0] != Packet::MAGIC ||
                 bytes_read < Packet::HEADER_LENGTH) {
        return;
      }
      Packet(data, socket, k);
    }
  } catch (std::exception& e) {
    std::cerr << "Exception in thread: " << e.what() << std::endl;
  }
}